

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

int cfg_db_remove_entry(cfg_db *db,char *section_type,char *section_name,char *entry_name)

{
  cfg_entry *entry_00;
  cfg_entry *entry;
  char *entry_name_local;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  entry_00 = cfg_db_find_entry(db,section_type,section_name,entry_name);
  if (entry_00 == (cfg_entry *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    _free_entry(entry_00);
    db_local._4_4_ = 0;
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_db_remove_entry(struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name) {
  struct cfg_entry *entry;

  /* get entry */
  entry = cfg_db_find_entry(db, section_type, section_name, entry_name);
  if (entry == NULL) {
    /* entry not there */
    return -1;
  }

  _free_entry(entry);
  return 0;
}